

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O2

size_t ZSTD_toFlushNow(ZSTD_CCtx *cctx)

{
  size_t sVar1;
  
  if (0 < (cctx->appliedParams).nbWorkers) {
    sVar1 = ZSTDMT_toFlushNow(cctx->mtctx);
    return sVar1;
  }
  return 0;
}

Assistant:

size_t ZSTD_toFlushNow(ZSTD_CCtx* cctx)
{
#ifdef ZSTD_MULTITHREAD
    if (cctx->appliedParams.nbWorkers > 0) {
        return ZSTDMT_toFlushNow(cctx->mtctx);
    }
#endif
    (void)cctx;
    return 0;   /* over-simplification; could also check if context is currently running in streaming mode, and in which case, report how many bytes are left to be flushed within output buffer */
}